

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O0

TextureId __thiscall
solitaire::graphics::SDLGraphicsSystem::loadTexture(SDLGraphicsSystem *this,string *path)

{
  runtime_error *this_00;
  size_type sVar1;
  string *in_RDX;
  uint local_84;
  UniquePtr<SDL_Surface> local_80;
  UniquePtr<SDL_Texture> local_58;
  string *path_local;
  SDLGraphicsSystem *this_local;
  
  path_local = path;
  this_local = this;
  if ((path[3].field_2._M_local_buf[9] & 1U) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Cannot load texture when window not created");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  createSDLSurfaceOrThrow(&local_80,(SDLGraphicsSystem *)path,in_RDX);
  createSDLTextureOrThrow(&local_58,(SDLGraphicsSystem *)path,&local_80);
  std::
  vector<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>,std::allocator<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>>>
  ::emplace_back<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>>
            ((vector<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>,std::allocator<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>>>
              *)(path + 3),&local_58);
  std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>::~unique_ptr(&local_58);
  std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>::~unique_ptr(&local_80);
  sVar1 = std::
          vector<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
          ::size((vector<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
                  *)(path + 3));
  local_84 = (int)sVar1 - 1;
  TextureId::TextureId((TextureId *)this,&local_84);
  return (TextureId)(uint)this;
}

Assistant:

TextureId SDLGraphicsSystem::loadTexture(const std::string& path) {
    if (not isWindowCreated)
        throw std::runtime_error {"Cannot load texture when window not created"};

    textures.emplace_back(createSDLTextureOrThrow(createSDLSurfaceOrThrow(path)));

    return TextureId {static_cast<unsigned>(textures.size() - 1)};
}